

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashBinGeneric.h
# Opt level: O2

void __thiscall BinHash<IPStatsRecord>::Clear(BinHash<IPStatsRecord> *this)

{
  IPStatsRecord *this_00;
  IPStatsRecord **ppIVar1;
  IPStatsRecord *x;
  uint32_t i;
  ulong uVar2;
  
  ppIVar1 = this->hashBin;
  if (ppIVar1 != (IPStatsRecord **)0x0) {
    for (uVar2 = 0; uVar2 < this->tableSize; uVar2 = uVar2 + 1) {
      while (this_00 = ppIVar1[uVar2], this_00 != (IPStatsRecord *)0x0) {
        ppIVar1[uVar2] = this_00->HashNext;
        IPStatsRecord::~IPStatsRecord(this_00);
        operator_delete(this_00);
        ppIVar1 = this->hashBin;
      }
    }
    operator_delete__(ppIVar1);
    this->hashBin = (IPStatsRecord **)0x0;
  }
  this->tableSize = 0;
  this->tableCount = 0;
  return;
}

Assistant:

void Clear()
    {
        if (hashBin != NULL)
        {
            for (uint32_t i = 0; i < tableSize; i++)
            {
                while (hashBin[i] != NULL)
                {
                    KeyObj *x = hashBin[i];
                    hashBin[i] = x->HashNext;
                    delete x;
                }
            }

            delete[] hashBin;
            hashBin = NULL;
        }

        tableCount = 0;
        tableSize = 0;
    }